

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat_solver.cpp
# Opt level: O0

bool __thiscall
Satyricon::SATSolver::new_clause
          (SATSolver *this,vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_> *c,
          bool learnt,ClausePtr *c_ref)

{
  int iVar1;
  ulong uVar2;
  size_t __n;
  bool bVar3;
  literal_value lVar4;
  uint uVar5;
  size_type sVar6;
  reference pvVar7;
  reference pvVar8;
  Clause *pCVar9;
  Iterator pLVar10;
  Iterator pLVar11;
  reference pvVar12;
  Literal *pLVar13;
  char *pcVar14;
  reference pvVar15;
  int __c;
  int __c_00;
  Watcher local_80;
  Watcher local_78;
  int local_6c;
  Iterator pLStack_68;
  Literal tmp;
  Iterator it;
  Iterator second;
  ulong local_50;
  size_t k;
  ulong uStack_40;
  bool add;
  size_t i;
  size_t j;
  ClausePtr *c_ref_local;
  vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_> *pvStack_20;
  bool learnt_local;
  vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_> *c_local;
  SATSolver *this_local;
  
  *c_ref = (ClausePtr)0x0;
  j = (size_t)c_ref;
  c_ref_local._7_1_ = learnt;
  pvStack_20 = c;
  c_local = (vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_> *)this;
  if (!learnt) {
    i = 0;
    for (uStack_40 = 0; uVar2 = uStack_40,
        sVar6 = std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::size
                          (pvStack_20), uVar2 < sVar6; uStack_40 = uStack_40 + 1) {
      pvVar7 = std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::operator[]
                         (pvStack_20,uStack_40);
      lVar4 = get_asigned_value(this,pvVar7);
      if (lVar4 != LIT_FALSE) {
        pvVar7 = std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::operator[]
                           (pvStack_20,uStack_40);
        lVar4 = get_asigned_value(this,pvVar7);
        if (lVar4 == LIT_TRUE) {
          return false;
        }
        k._7_1_ = 1;
        local_50 = uStack_40;
        while( true ) {
          local_50 = local_50 + 1;
          uVar2 = local_50;
          sVar6 = std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::size
                            (pvStack_20);
          if (sVar6 <= uVar2) break;
          pvVar7 = std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::operator[]
                             (pvStack_20,local_50);
          pvVar8 = std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::operator[]
                             (pvStack_20,uStack_40);
          bVar3 = Literal::operator==(pvVar7,pvVar8);
          if (bVar3) {
            k._7_1_ = 0;
            break;
          }
          pvVar7 = std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::operator[]
                             (pvStack_20,local_50);
          pvVar8 = std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::operator[]
                             (pvStack_20,uStack_40);
          second._4_4_ = Literal::operator!(pvVar8);
          bVar3 = Literal::operator==(pvVar7,(Literal *)((long)&second + 4));
          if (bVar3) {
            return false;
          }
        }
        if ((k._7_1_ & 1) != 0) {
          pvVar7 = std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::operator[]
                             (pvStack_20,uStack_40);
          __n = i;
          i = i + 1;
          pvVar8 = std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::operator[]
                             (pvStack_20,__n);
          pvVar8->value = pvVar7->value;
        }
      }
    }
    std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::resize(pvStack_20,i);
  }
  bVar3 = std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::empty(pvStack_20);
  if (bVar3) {
    this_local._7_1_ = true;
  }
  else {
    sVar6 = std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::size(pvStack_20);
    if (sVar6 == 1) {
      pvVar7 = std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::operator[]
                         (pvStack_20,0);
      second._0_4_ = pvVar7->value;
      this_local._7_1_ = assign(this,second._0_4_,(ClausePtr)0x0);
    }
    else {
      pCVar9 = Clause::allocate(pvStack_20,(bool)(c_ref_local._7_1_ & 1));
      *(Clause **)j = pCVar9;
      if ((c_ref_local._7_1_ & 1) != 0) {
        pLVar10 = Clause::begin(*(Clause **)j);
        it = pLVar10 + 1;
        pLStack_68 = Clause::begin(*(Clause **)j);
        for (pLStack_68 = pLStack_68 + 2; pLVar10 = pLStack_68, pLVar11 = Clause::end(*(Clause **)j)
            , pLVar10 != pLVar11; pLStack_68 = pLStack_68 + 1) {
          uVar5 = Literal::var(pLStack_68);
          pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&this->decision_levels,(ulong)uVar5);
          iVar1 = *pvVar12;
          uVar5 = Literal::var(it);
          pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&this->decision_levels,(ulong)uVar5);
          if (*pvVar12 < iVar1) {
            it = pLStack_68;
          }
        }
        local_6c = it->value;
        pLVar13 = Clause::at(*(Clause **)j,1);
        it->value = pLVar13->value;
        pLVar13 = Clause::at(*(Clause **)j,1);
        pLVar13->value = local_6c;
        Clause::update_activity(*(Clause **)j,(this->param).clause_activity_update);
      }
      pcVar14 = (char *)0x0;
      pLVar13 = Clause::at(*(Clause **)j,0);
      pcVar14 = Literal::index(pLVar13,pcVar14,__c);
      pvVar15 = std::
                vector<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>,_std::allocator<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>_>_>
                ::operator[](&this->watch_list,(ulong)pcVar14 & 0xffffffff);
      Watcher::Watcher(&local_78,*(ClausePtr *)j);
      std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>::
      push_back(pvVar15,&local_78);
      pcVar14 = (char *)0x1;
      pLVar13 = Clause::at(*(Clause **)j,1);
      pcVar14 = Literal::index(pLVar13,pcVar14,__c_00);
      pvVar15 = std::
                vector<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>,_std::allocator<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>_>_>
                ::operator[](&this->watch_list,(ulong)pcVar14 & 0xffffffff);
      Watcher::Watcher(&local_80,*(ClausePtr *)j);
      std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>::
      push_back(pvVar15,&local_80);
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool SATSolver::new_clause(vector<Literal> &c, bool learnt, ClausePtr &c_ref) {

    c_ref = nullptr;

    if ( ! learnt ) { // simplify if possible, learned clause doesn't need this
        size_t j = 0;
        for ( size_t i = 0; i < c.size(); i++ ) {
            // discard false literal
            if ( get_asigned_value( c[i] ) == LIT_FALSE ) continue;
            // already satisfied?
            if ( get_asigned_value( c[i] ) == LIT_TRUE  )
                return false; // no conflict, new clause is a nullptr
            // look for tautology or repetition
            bool add = true;
            for ( size_t k = i+1; k < c.size(); ++k ) {
                if ( c[k] == c[i] ) { // repetition?
                    add = false;      // don't add the repeated literal
                    break;
                }
                if ( c[k] == !(c[i]) ) // tautology?
                    return false; // no conflict, new clause is a nullptr 
            }
            if ( add ) c[j++] = c[i];
        }
        c.resize(j);
    }

    // an empty clause is a conflict
    if (c.empty()) return true; // conflict, cnew clause is a nullptr

    // a clause with 1 literal is a unit, simply assign it
    if ( c.size() == 1 ) {
        // true if the assignment is in conflict, false otherwise
        // the new clause is a nullptr (don't build clause of one literal)
        return  assign( c[0], nullptr );
    }

    // build the clause
    c_ref = Clause::allocate(c,learnt);

    if ( learnt ) { 
        // pick a correct second literal to watch
        auto second = c_ref->begin()+1;
        for ( auto it = c_ref->begin()+2; it != c_ref->end(); ++it)
            if ( decision_levels[it->var()] > decision_levels[second->var()] )
                second = it;
        // swap
        Literal tmp = *second;
        *second = c_ref->at(1);
        c_ref->at(1) = tmp;

        // increase activity
        c_ref->update_activity( param.clause_activity_update );
    }

    //  add to the watch list
    watch_list[c_ref->at(0).index()].push_back(Watcher(c_ref));
    watch_list[c_ref->at(1).index()].push_back(Watcher(c_ref));

    return false; // no conflict
}